

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O2

int archive_write_pax_options(archive_write *a,char *key,char *val)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  archive_string_conv *paVar4;
  char *fmt;
  
  pvVar1 = a->format_data;
  iVar2 = strcmp(key,"hdrcharset");
  if (iVar2 == 0) {
    if ((val == (char *)0x0) || (*val == '\0')) {
      fmt = "pax: hdrcharset option needs a character-set name";
    }
    else {
      iVar2 = strcmp(val,"BINARY");
      if ((iVar2 == 0) || (iVar2 = strcmp(val,"binary"), iVar2 == 0)) {
        *(undefined4 *)((long)pvVar1 + 0x78) = 1;
        return 0;
      }
      iVar2 = strcmp(val,"UTF-8");
      if (iVar2 == 0) {
        paVar4 = archive_string_conversion_to_charset((archive_conflict *)a,"UTF-8",L'\0');
        *(archive_string_conv **)((long)pvVar1 + 0x70) = paVar4;
        if (paVar4 != (archive_string_conv *)0x0) {
          return 0;
        }
        return -0x1e;
      }
      fmt = "pax: invalid charset name";
    }
  }
  else {
    iVar2 = strcmp(key,"xattrheader");
    if (iVar2 != 0) {
      return -0x14;
    }
    if ((val != (char *)0x0) && (*val != '\0')) {
      iVar2 = strcmp(val,"ALL");
      if ((iVar2 == 0) || (iVar2 = strcmp(val,"all"), iVar2 == 0)) {
        *(byte *)((long)pvVar1 + 0x7c) = *(byte *)((long)pvVar1 + 0x7c) | 3;
      }
      else {
        iVar2 = strcmp(val,"SCHILY");
        if ((iVar2 == 0) || (iVar2 = strcmp(val,"schily"), iVar2 == 0)) {
          uVar3 = (*(uint *)((long)pvVar1 + 0x7c) & 0xfffffffc) + 1;
        }
        else {
          iVar2 = strcmp(val,"LIBARCHIVE");
          if ((iVar2 != 0) && (iVar2 = strcmp(val,"libarchive"), iVar2 != 0)) {
            fmt = "pax: invalid xattr header name";
            goto LAB_0016cc83;
          }
          uVar3 = *(uint *)((long)pvVar1 + 0x7c) & 0xfffffffc | 2;
        }
        *(uint *)((long)pvVar1 + 0x7c) = uVar3;
      }
      return 0;
    }
    fmt = "pax: xattrheader requires a value";
  }
LAB_0016cc83:
  archive_set_error(&a->archive,-1,fmt);
  return -0x19;
}

Assistant:

static int
archive_write_pax_options(struct archive_write *a, const char *key,
    const char *val)
{
	struct pax *pax = (struct pax *)a->format_data;
	int ret = ARCHIVE_FAILED;

	if (strcmp(key, "hdrcharset")  == 0) {
		/*
		 * The character-set we can use are defined in
		 * IEEE Std 1003.1-2001
		 */
		if (val == NULL || val[0] == 0)
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "pax: hdrcharset option needs a character-set name");
		else if (strcmp(val, "BINARY") == 0 ||
		    strcmp(val, "binary") == 0) {
			/*
			 * Specify binary mode. We will not convert
			 * filenames, uname and gname to any charsets.
			 */
			pax->opt_binary = 1;
			ret = ARCHIVE_OK;
		} else if (strcmp(val, "UTF-8") == 0) {
			/*
			 * Specify UTF-8 character-set to be used for
			 * filenames. This is almost the test that
			 * running platform supports the string conversion.
			 * Especially libarchive_test needs this trick for
			 * its test.
			 */
			pax->sconv_utf8 = archive_string_conversion_to_charset(
			    &(a->archive), "UTF-8", 0);
			if (pax->sconv_utf8 == NULL)
				ret = ARCHIVE_FATAL;
			else
				ret = ARCHIVE_OK;
		} else
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "pax: invalid charset name");
		return (ret);
	} else if (strcmp(key, "xattrheader") == 0) {
		if (val == NULL || val[0] == 0) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "pax: xattrheader requires a value");
		} else if (strcmp(val, "ALL") == 0 ||
		    strcmp(val, "all") == 0) {
			pax->flags |= WRITE_LIBARCHIVE_XATTR | WRITE_SCHILY_XATTR;
			ret = ARCHIVE_OK;
		} else if (strcmp(val, "SCHILY") == 0 ||
		    strcmp(val, "schily") == 0) {
			pax->flags |= WRITE_SCHILY_XATTR;
			pax->flags &= ~WRITE_LIBARCHIVE_XATTR;
			ret = ARCHIVE_OK;
		} else if (strcmp(val, "LIBARCHIVE") == 0 ||
		    strcmp(val, "libarchive") == 0) {
			pax->flags |= WRITE_LIBARCHIVE_XATTR;
			pax->flags &= ~WRITE_SCHILY_XATTR;
			ret = ARCHIVE_OK;
		} else
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "pax: invalid xattr header name");
		return (ret);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}